

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O3

uint __thiscall
btAxisSweep3Internal<unsigned_int>::addHandle
          (btAxisSweep3Internal<unsigned_int> *this,btVector3 *aabbMin,btVector3 *aabbMax,
          void *pOwner,short collisionFilterGroup,short collisionFilterMask,btDispatcher *dispatcher
          ,void *multiSapProxy)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  Handle *pHVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint min [3];
  uint local_48 [6];
  
  lVar9 = 0;
  quantize(this,local_48 + 3,aabbMin,0);
  quantize(this,local_48,aabbMax,1);
  uVar4 = this->m_firstFreeHandle;
  pHVar6 = this->m_pHandles;
  this->m_firstFreeHandle = *(uint *)&pHVar6[uVar4].super_btBroadphaseProxy.field_0x3c;
  uVar5 = this->m_numHandles;
  this->m_numHandles = uVar5 + 1;
  pHVar6[uVar4].super_btBroadphaseProxy.m_uniqueId = uVar4;
  pHVar6[uVar4].super_btBroadphaseProxy.m_clientObject = pOwner;
  pHVar6[uVar4].super_btBroadphaseProxy.m_collisionFilterGroup = collisionFilterGroup;
  pHVar6[uVar4].super_btBroadphaseProxy.m_collisionFilterMask = collisionFilterMask;
  pHVar6[uVar4].super_btBroadphaseProxy.m_multiSapParentProxy = multiSapProxy;
  uVar1 = uVar5 * 2 + 2;
  uVar2 = uVar5 * 2 + 1;
  uVar8 = (ulong)uVar2;
  do {
    piVar3 = (int *)((long)this->m_pHandles->m_maxEdges + lVar9);
    *piVar3 = *piVar3 + 2;
    lVar7 = *(long *)((long)this->m_pEdges + lVar9 * 2);
    *(undefined8 *)(lVar7 + (ulong)(uVar5 * 2 + 3) * 8) = *(undefined8 *)(lVar7 + uVar8 * 8);
    lVar7 = *(long *)((long)this->m_pEdges + lVar9 * 2);
    *(undefined4 *)(lVar7 + uVar8 * 8) = *(undefined4 *)((long)local_48 + lVar9 + 0xc);
    *(uint *)(lVar7 + 4 + uVar8 * 8) = uVar4;
    *(undefined4 *)(lVar7 + (ulong)uVar1 * 8) = *(undefined4 *)((long)local_48 + lVar9);
    *(uint *)(lVar7 + 4 + (ulong)uVar1 * 8) = uVar4;
    *(uint *)((long)(&pHVar6[uVar4].super_btBroadphaseProxy.m_aabbMax + 1) + lVar9) = uVar2;
    *(uint *)((long)pHVar6[uVar4].m_maxEdges + lVar9) = uVar1;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0xc);
  sortMinDown(this,0,*(uint *)&pHVar6[uVar4].super_btBroadphaseProxy.field_0x3c,dispatcher,false);
  sortMaxDown(this,0,pHVar6[uVar4].m_maxEdges[0],dispatcher,false);
  sortMinDown(this,1,*(uint *)&pHVar6[uVar4].field_0x40,dispatcher,false);
  sortMaxDown(this,1,pHVar6[uVar4].m_maxEdges[1],dispatcher,false);
  sortMinDown(this,2,*(uint *)&pHVar6[uVar4].field_0x44,dispatcher,true);
  sortMaxDown(this,2,pHVar6[uVar4].m_maxEdges[2],dispatcher,true);
  return uVar4;
}

Assistant:

BP_FP_INT_TYPE btAxisSweep3Internal<BP_FP_INT_TYPE>::addHandle(const btVector3& aabbMin,const btVector3& aabbMax, void* pOwner,short int collisionFilterGroup,short int collisionFilterMask,btDispatcher* dispatcher,void* multiSapProxy)
{
	// quantize the bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// allocate a handle
	BP_FP_INT_TYPE handle = allocHandle();
	

	Handle* pHandle = getHandle(handle);
	
	pHandle->m_uniqueId = static_cast<int>(handle);
	//pHandle->m_pOverlaps = 0;
	pHandle->m_clientObject = pOwner;
	pHandle->m_collisionFilterGroup = collisionFilterGroup;
	pHandle->m_collisionFilterMask = collisionFilterMask;
	pHandle->m_multiSapParentProxy = multiSapProxy;

	// compute current limit of edge arrays
	BP_FP_INT_TYPE limit = static_cast<BP_FP_INT_TYPE>(m_numHandles * 2);

	
	// insert new edges just inside the max boundary edge
	for (BP_FP_INT_TYPE axis = 0; axis < 3; axis++)
	{

		m_pHandles[0].m_maxEdges[axis] += 2;

		m_pEdges[axis][limit + 1] = m_pEdges[axis][limit - 1];

		m_pEdges[axis][limit - 1].m_pos = min[axis];
		m_pEdges[axis][limit - 1].m_handle = handle;

		m_pEdges[axis][limit].m_pos = max[axis];
		m_pEdges[axis][limit].m_handle = handle;

		pHandle->m_minEdges[axis] = static_cast<BP_FP_INT_TYPE>(limit - 1);
		pHandle->m_maxEdges[axis] = limit;
	}

	// now sort the new edges to their correct position
	sortMinDown(0, pHandle->m_minEdges[0], dispatcher,false);
	sortMaxDown(0, pHandle->m_maxEdges[0], dispatcher,false);
	sortMinDown(1, pHandle->m_minEdges[1], dispatcher,false);
	sortMaxDown(1, pHandle->m_maxEdges[1], dispatcher,false);
	sortMinDown(2, pHandle->m_minEdges[2], dispatcher,true);
	sortMaxDown(2, pHandle->m_maxEdges[2], dispatcher,true);


	return handle;
}